

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ansv.cpp
# Opt level: O3

void par_test_ansv_localidx<unsigned_long,1,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,comm *c)

{
  ulong uVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_00;
  bool bVar2;
  unsigned_long uVar3;
  pointer puVar4;
  pointer puVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  MPI_Comm expected_predicate_value;
  int result;
  int i;
  AssertionResult gtest_ar_;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vec;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  lr_mins;
  Message local_f0;
  string local_e8;
  AssertHelper local_c0;
  internal local_b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  mxx::impl::distribute_container<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  stable_distribute(&local_70,in,c);
  local_e8._M_dataplus._M_p =
       (pointer)((long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
  uVar3 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_e8,c);
  uVar7 = 0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ansv<unsigned_long,1,1,1>(&local_70,&local_88,&local_a8,&local_58,c,0xffffffffffffffff);
  if ((long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
    uVar7 = (uint)((long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start ==
                  (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  }
  local_e8._M_dataplus._M_p._0_4_ = uVar7;
  expected_predicate_value = c->mpi_comm;
  MPI_Allreduce(&local_e8,&local_f0,1,&ompi_mpi_int,&ompi_mpi_op_land);
  local_b8[0] = (internal)((int)local_f0.ss_.ptr_ != 0);
  local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((int)local_f0.ss_.ptr_ == 0) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,local_b8,
               (AssertionResult *)
               "mxx::all_of(vec.size() == left_nsv.size() && vec.size() == right_nsv.size(), c)",
               "false","true",(char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
               ,0xa3,local_e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if (CONCAT44(local_f0.ss_.ptr_._4_4_,(int)local_f0.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_f0.ss_.ptr_._4_4_,(int)local_f0.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_f0.ss_.ptr_._4_4_,(int)local_f0.ss_.ptr_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    local_38 = in;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      uVar6 = (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      uVar8 = 0;
      puVar4 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        uVar1 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8];
        if (uVar1 != 0xffffffffffffffff) {
          if (uVar1 < uVar6) {
            local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] = uVar1 + uVar3;
          }
          else {
            local_b8[0] = (internal)
                          (uVar1 < ((long)local_58.
                                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_58.
                                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4) + uVar6);
            local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
            ;
            if (!(bool)local_b8[0]) {
              testing::Message::Message(&local_f0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_e8,local_b8,
                         (AssertionResult *)
                         "left_nsv[i] >= vec.size() && left_nsv[i] < vec.size()+lr_mins.size()",
                         "false","true",(char *)expected_predicate_value);
              testing::internal::AssertHelper::AssertHelper
                        (&local_c0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                         ,0xb4,local_e8._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_c0,&local_f0);
              testing::internal::AssertHelper::~AssertHelper(&local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p);
              }
              if (CONCAT44(local_f0.ss_.ptr_._4_4_,(int)local_f0.ss_.ptr_) != 0) {
                bVar2 = testing::internal::IsTrue(true);
                if ((bVar2) &&
                   ((long *)CONCAT44(local_f0.ss_.ptr_._4_4_,(int)local_f0.ss_.ptr_) != (long *)0x0)
                   ) {
                  (**(code **)(*(long *)CONCAT44(local_f0.ss_.ptr_._4_4_,(int)local_f0.ss_.ptr_) + 8
                              ))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_b0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] =
                 local_58.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar8] -
                  ((ulong)((long)local_70.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_70.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3)].second;
            puVar4 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            puVar5 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          }
        }
        uVar1 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8];
        uVar6 = (long)puVar5 - (long)puVar4 >> 3;
        if (uVar1 != 0xffffffffffffffff) {
          if (uVar1 < uVar6) {
            local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] = uVar1 + uVar3;
          }
          else {
            local_b8[0] = (internal)
                          (uVar1 < ((long)local_58.
                                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_58.
                                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4) + uVar6);
            local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
            ;
            if (!(bool)local_b8[0]) {
              testing::Message::Message(&local_f0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_e8,local_b8,
                         (AssertionResult *)
                         "right_nsv[i] >= vec.size() && right_nsv[i] < vec.size()+lr_mins.size()",
                         "false","true",(char *)expected_predicate_value);
              testing::internal::AssertHelper::AssertHelper
                        (&local_c0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                         ,0xbe,local_e8._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_c0,&local_f0);
              testing::internal::AssertHelper::~AssertHelper(&local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p);
              }
              if (CONCAT44(local_f0.ss_.ptr_._4_4_,(int)local_f0.ss_.ptr_) != 0) {
                bVar2 = testing::internal::IsTrue(true);
                if ((bVar2) &&
                   ((long *)CONCAT44(local_f0.ss_.ptr_._4_4_,(int)local_f0.ss_.ptr_) != (long *)0x0)
                   ) {
                  (**(code **)(*(long *)CONCAT44(local_f0.ss_.ptr_._4_4_,(int)local_f0.ss_.ptr_) + 8
                              ))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_b0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            uVar6 = (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3;
            local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] =
                 local_58.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar8] - uVar6].second;
            puVar4 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            puVar5 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar6);
    }
    mxx::gatherv<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,
               local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3,0,c);
    in_00 = local_38;
    puVar4 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_e8._M_dataplus._M_p;
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_e8._M_string_length;
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_e8.field_2._M_allocated_capacity;
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity = 0;
    if (puVar4 != (unsigned_long *)0x0) {
      operator_delete(puVar4);
      if ((unsigned_long *)local_e8._M_dataplus._M_p != (unsigned_long *)0x0) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
    }
    mxx::gatherv<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,
               local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3,0,c);
    puVar4 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_e8._M_dataplus._M_p;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_e8._M_string_length;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_e8.field_2._M_allocated_capacity;
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity = 0;
    if (puVar4 != (unsigned_long *)0x0) {
      operator_delete(puVar4);
      if ((unsigned_long *)local_e8._M_dataplus._M_p != (unsigned_long *)0x0) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
    }
    if (c->m_rank == 0) {
      check_ansv<unsigned_long,1>(in_00,&local_88,true,0xffffffffffffffff);
      check_ansv<unsigned_long,1>(in_00,&local_a8,false,0xffffffffffffffff);
    }
  }
  if (local_58.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void par_test_ansv_localidx(const std::vector<T>& in, const mxx::comm& c) {
    std::vector<size_t> vec = mxx::stable_distribute(in, c);

    size_t prefix = mxx::exscan(vec.size(), c);

    // calc ansv
    std::vector<size_t> left_nsv;
    std::vector<size_t> right_nsv;
    std::vector<std::pair<T, size_t>> lr_mins;

    const size_t nonsv = std::numeric_limits<size_t>::max();
    ansv<T,left_type,right_type,local_indexing>(vec, left_nsv, right_nsv, lr_mins, c, nonsv);
    ASSERT_TRUE(mxx::all_of(vec.size() == left_nsv.size() && vec.size() == right_nsv.size(), c));

    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: in=" << in << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: vec=" << vec << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: left=" << left_nsv << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: right=" << right_nsv << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: lrmin=" << lr_mins << std::endl;

    // resolve local indexing into global indexing
    // FIXME: now we actually have to use a special value for non-matched
    for (size_t i = 0; i < vec.size(); ++i) {
        // resolve left
        if (left_nsv[i] != nonsv) {
            if (left_nsv[i] < vec.size()) {
                // this is a local element, add prefix
                left_nsv[i] += prefix;
            } else {
                EXPECT_TRUE(left_nsv[i] >= vec.size() && left_nsv[i] < vec.size()+lr_mins.size());
                left_nsv[i] = lr_mins[left_nsv[i]-vec.size()].second;
            }
        }
        // resolve right
        if (right_nsv[i] != nonsv) {
            if (right_nsv[i] < vec.size()) {
                // this is a local element, add prefix
                right_nsv[i] += prefix;
            } else {
                EXPECT_TRUE(right_nsv[i] >= vec.size() && right_nsv[i] < vec.size()+lr_mins.size());
                right_nsv[i] = lr_mins[right_nsv[i]-vec.size()].second;
            }
        }
    }


    left_nsv = mxx::gatherv(left_nsv, 0, c);
    right_nsv = mxx::gatherv(right_nsv, 0, c);

    if (c.rank() == 0) {
        check_ansv<T,left_type>(in, left_nsv, true, nonsv);
        check_ansv<T,right_type>(in, right_nsv, false, nonsv);
    }
}